

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

_Bool netaddr_binary_is_in_subnet(netaddr *subnet,void *bin,size_t len,uint8_t af_family)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  ulong __n;
  _Bool _Var4;
  
  if (subnet->_type != af_family) {
    return false;
  }
  if (af_family < 0x2f) {
    if (af_family == '\x02') {
      lVar2 = 0x20;
      goto LAB_00146ba8;
    }
    if (af_family == '\n') {
      lVar2 = 0x80;
      goto LAB_00146ba8;
    }
  }
  else {
    if (af_family == '/') {
      lVar2 = 0x30;
      goto LAB_00146ba8;
    }
    if (af_family == '0') {
      lVar2 = 0x40;
      goto LAB_00146ba8;
    }
  }
  lVar2 = 0;
LAB_00146ba8:
  if (len * 8 != lVar2) {
    return false;
  }
  bVar3 = subnet->_prefix_len;
  __n = (ulong)(bVar3 >> 3);
  iVar1 = bcmp(subnet,bin,__n);
  if (iVar1 == 0) {
    if ((bVar3 & 7) == 0) {
      _Var4 = true;
    }
    else {
      bVar3 = 8 - (bVar3 & 7);
      _Var4 = subnet->_addr[__n] >> (bVar3 & 0x1f) == *(byte *)((long)bin + __n) >> (bVar3 & 0x1f);
    }
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool
netaddr_binary_is_in_subnet(const struct netaddr *subnet, const void *bin, size_t len, uint8_t af_family) {
  if (subnet->_type != af_family || netaddr_get_maxprefix(subnet) != len * 8) {
    return false;
  }
  return _binary_is_in_subnet(subnet, bin);
}